

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestSub.c
# Opt level: O0

void sbfRequestSub_destroy(sbfRequestSub sub)

{
  undefined8 *in_RDI;
  
  sbfLog_log(*in_RDI,0,"destroying request subscription %p",in_RDI);
  if (in_RDI[5] != 0) {
    sbfPub_destroy(in_RDI[5]);
  }
  if (in_RDI[7] != 0) {
    sbfSub_destroy(in_RDI[7]);
  }
  free((void *)in_RDI[1]);
  free(in_RDI);
  return;
}

Assistant:

void
sbfRequestSub_destroy (sbfRequestSub sub)
{
    sbfLog_debug (sub->mLog, "destroying request subscription %p", sub);

    if (sub->mPub != NULL)
        sbfPub_destroy (sub->mPub);
    if (sub->mSub != NULL)
        sbfSub_destroy (sub->mSub);

    free ((void*)sub->mTopic);
    free (sub);
}